

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Type __thiscall wasm::TranslateToFuzzReader::getConcreteType(TranslateToFuzzReader *this)

{
  bool bVar1;
  TranslateToFuzzReader *this_local;
  
  bVar1 = FeatureSet::hasMultivalue(&this->wasm->features);
  if ((bVar1) && (bVar1 = oneIn(this,5), bVar1)) {
    this_local = (TranslateToFuzzReader *)getTupleType(this);
  }
  else {
    this_local = (TranslateToFuzzReader *)getSingleConcreteType(this);
  }
  return (Type)(uintptr_t)this_local;
}

Assistant:

Type TranslateToFuzzReader::getConcreteType() {
  if (wasm.features.hasMultivalue() && oneIn(5)) {
    return getTupleType();
  } else {
    return getSingleConcreteType();
  }
}